

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  vec<unsigned_int> *pvVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  undefined7 in_register_00000031;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this_00;
  Var best;
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  Queue<unsigned_int> *local_50;
  uint local_48;
  undefined4 local_44;
  long local_40;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,verbose);
  local_50 = &this->subsumption_queue;
  local_38 = &this->occurs;
  local_5c = 0;
  local_58 = 0;
  local_54 = 0;
  this_00 = local_38;
  do {
    do {
      do {
        iVar13 = (this->subsumption_queue).end;
        iVar19 = (this->subsumption_queue).buf.sz;
        iVar16 = (this->subsumption_queue).first;
        iVar15 = iVar13 - iVar16;
        iVar18 = 0;
        if (iVar13 < iVar16) {
          iVar18 = iVar19;
        }
        iVar13 = iVar18 + iVar15;
        if ((iVar13 == 0 || SCARRY4(iVar18,iVar15) != iVar13 < 0) &&
           ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
          return true;
        }
        if ((this->super_Solver).asynch_interrupt == true) {
          if ((local_50->buf).data != (uint *)0x0) {
            (this->subsumption_queue).buf.sz = 0;
          }
          vec<unsigned_int>::growTo(&local_50->buf,1);
          (this->subsumption_queue).first = 0;
          (this->subsumption_queue).end = 0;
          this->bwdsub_assigns = (this->super_Solver).trail.sz;
          return true;
        }
        if (iVar13 == 0) {
          iVar13 = this->bwdsub_assigns;
          if (iVar13 < (this->super_Solver).trail.sz) {
            this->bwdsub_assigns = iVar13 + 1;
            puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
            puVar3[(ulong)this->bwdsub_tmpunit + 3] = (this->super_Solver).trail.data[iVar13].x;
            puVar1 = (ulong *)(puVar3 + this->bwdsub_tmpunit);
            uVar11 = *puVar1 >> 0x20;
            if ((int)(*puVar1 >> 0x20) < 1) {
              uVar14 = 0;
            }
            else {
              uVar17 = 0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 | 1 << (*(byte *)((long)puVar1 + uVar17 * 4 + 0xc) >> 1 & 0x1f);
                uVar17 = uVar17 + 1;
              } while (uVar11 != uVar17);
            }
            *(uint *)((long)puVar1 + uVar11 * 4 + 0xc) = uVar14;
            Queue<unsigned_int>::insert(local_50,this->bwdsub_tmpunit);
            iVar19 = (this->subsumption_queue).buf.sz;
            iVar16 = (this->subsumption_queue).first;
          }
        }
        uVar14 = (this->subsumption_queue).buf.data[iVar16];
        iVar13 = iVar16 + 1;
        if (iVar16 + 1 == iVar19) {
          iVar13 = 0;
        }
        (this->subsumption_queue).first = iVar13;
        puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar11 = *(ulong *)(puVar3 + uVar14);
      } while ((uVar11 & 3) != 0);
      puVar1 = (ulong *)(puVar3 + uVar14);
      if ((((char)local_44 != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar16 = local_54 * 0x26e978d5, iVar18 = local_54 + 1, uVar6 = local_54 * -0x60000000,
         local_54 = iVar18, (iVar16 + 0x10624d8U >> 3 | uVar6) < 0x418937)) {
        iVar16 = (this->subsumption_queue).end;
        if (iVar13 <= iVar16) {
          iVar19 = 0;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar16 - iVar13) + iVar19),(ulong)local_58,(ulong)local_5c);
        uVar11 = *puVar1;
      }
      iVar13 = *(int *)((long)puVar1 + 0xc) >> 1;
      local_60 = iVar13;
      if (1 < (int)(uVar11 >> 0x20)) {
        pvVar4 = (this_00->occs).data;
        lVar9 = 4;
        do {
          iVar19 = *(int *)((long)puVar1 + lVar9 * 4) >> 1;
          if (pvVar4[iVar19].sz < pvVar4[iVar13].sz) {
            iVar13 = iVar19;
            local_60 = iVar19;
          }
          uVar17 = lVar9 - 2;
          lVar9 = lVar9 + 1;
        } while (uVar17 < uVar11 >> 0x20);
      }
      lVar9 = (long)iVar13;
      if ((this->occurs).dirty.data[lVar9] != '\0') {
        OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
                  (this_00,&local_60);
        lVar9 = (long)local_60;
      }
      pvVar4 = (this_00->occs).data;
      this_00 = local_38;
    } while (pvVar4[lVar9].sz < 1);
    local_40 = (long)puVar1 + 0xc;
    puVar3 = pvVar4[lVar9].data;
    iVar13 = 0;
    do {
      uVar11 = *puVar1;
      this_00 = local_38;
      if ((uVar11 & 3) != 0) break;
      uVar6 = puVar3[iVar13];
      if (uVar6 != uVar14) {
        puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar17 = *(ulong *)(puVar5 + uVar6);
        if ((uVar17 & 3) == 0) {
          uVar12 = uVar17 >> 0x20;
          uVar10 = (uint)(uVar17 >> 0x20);
          if (((this->subsumption_lim == -1) || ((int)uVar10 < this->subsumption_lim)) &&
             ((uVar17 = uVar11 >> 0x20, (uint)(uVar11 >> 0x20) <= uVar10 &&
              ((*(uint *)(local_40 + uVar17 * 4) & ~puVar5[(ulong)uVar6 + uVar12 + 3]) == 0)))) {
            if (uVar17 == 0) {
LAB_00116333:
              local_58 = local_58 + 1;
              removeClause(this,uVar6,false);
            }
            else if (uVar12 != 0) {
              uVar10 = 0xfffffffe;
              uVar11 = 0;
              do {
                uVar2 = *(uint *)(local_40 + uVar11 * 4);
                uVar20 = 0;
                while ((uVar7 = uVar10, uVar2 != puVar5[(ulong)uVar6 + uVar20 + 3] &&
                       ((uVar10 != 0xfffffffe ||
                        (uVar7 = uVar2, (puVar5[(ulong)uVar6 + uVar20 + 3] ^ uVar2) != 1))))) {
                  uVar20 = uVar20 + 1;
                  if (uVar12 == uVar20) goto LAB_00116348;
                }
                uVar10 = uVar7;
                uVar11 = uVar11 + 1;
              } while (uVar11 != uVar17);
              if (uVar10 != 0xffffffff) {
                if (uVar10 == 0xfffffffe) goto LAB_00116333;
                local_48 = uVar10;
                bVar8 = strengthenClause(this,uVar6,(Lit)(uVar10 ^ 1));
                if (!bVar8) {
                  return false;
                }
                local_5c = local_5c + 1;
                iVar13 = iVar13 - (uint)((int)local_48 >> 1 == local_60);
              }
            }
          }
        }
      }
LAB_00116348:
      iVar13 = iVar13 + 1;
      this_00 = local_38;
    } while (iVar13 < pvVar4[lVar9].sz);
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}